

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O2

void __thiscall
hta::Metric::Metric(Metric *this,
                   unique_ptr<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>
                   *storage_metric)

{
  _Rb_tree_header *p_Var1;
  rep extraout_RDX;
  Duration local_30;
  rep local_28;
  int64_t local_20;
  
  (this->storage_metric_)._M_t.
  super___uniq_ptr_impl<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>._M_t.
  super__Tuple_impl<0UL,_hta::storage::Metric_*,_std::default_delete<hta::storage::Metric>_>.
  super__Head_base<0UL,_hta::storage::Metric_*,_false>._M_head_impl =
       (storage_metric->_M_t).
       super___uniq_ptr_impl<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>._M_t.
       super__Tuple_impl<0UL,_hta::storage::Metric_*,_std::default_delete<hta::storage::Metric>_>.
       super__Head_base<0UL,_hta::storage::Metric_*,_false>._M_head_impl;
  (storage_metric->_M_t).
  super___uniq_ptr_impl<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>._M_t.
  super__Tuple_impl<0UL,_hta::storage::Metric_*,_std::default_delete<hta::storage::Metric>_>.
  super__Head_base<0UL,_hta::storage::Metric_*,_false>._M_head_impl = (Metric *)0x0;
  (**((this->storage_metric_)._M_t.
      super___uniq_ptr_impl<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>._M_t.
      super__Tuple_impl<0UL,_hta::storage::Metric_*,_std::default_delete<hta::storage::Metric>_>.
      super__Head_base<0UL,_hta::storage::Metric_*,_false>._M_head_impl)->_vptr_Metric)(&local_30);
  (this->interval_min_).__r = local_30.__r;
  (**((this->storage_metric_)._M_t.
      super___uniq_ptr_impl<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>._M_t.
      super__Tuple_impl<0UL,_hta::storage::Metric_*,_std::default_delete<hta::storage::Metric>_>.
      super__Head_base<0UL,_hta::storage::Metric_*,_false>._M_head_impl)->_vptr_Metric)();
  (this->interval_max_).__r = local_28;
  (**((this->storage_metric_)._M_t.
      super___uniq_ptr_impl<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>._M_t.
      super__Tuple_impl<0UL,_hta::storage::Metric_*,_std::default_delete<hta::storage::Metric>_>.
      super__Head_base<0UL,_hta::storage::Metric_*,_false>._M_head_impl)->_vptr_Metric)();
  (this->interval_factor_).factor_ = local_20;
  (*((this->storage_metric_)._M_t.
     super___uniq_ptr_impl<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>._M_t.
     super__Tuple_impl<0UL,_hta::storage::Metric_*,_std::default_delete<hta::storage::Metric>_>.
     super__Head_base<0UL,_hta::storage::Metric_*,_false>._M_head_impl)->_vptr_Metric[0xc])();
  (this->previous_time_).
  super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.__r =
       extraout_RDX;
  p_Var1 = &(this->levels_)._M_t._M_impl.super__Rb_tree_header;
  (this->levels_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->levels_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->levels_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->levels_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->levels_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  if ((this->interval_min_).__r <= (this->interval_max_).__r) {
    return;
  }
  throw_exception<hta::Exception,char_const*>("interval_min > interval_max");
}

Assistant:

Metric::Metric(std::unique_ptr<storage::Metric> storage_metric)
: storage_metric_(std::move(storage_metric)), interval_min_(storage_metric_->meta().interval_min),
  interval_max_(storage_metric_->meta().interval_max),
  interval_factor_(storage_metric_->meta().interval_factor),
  previous_time_(storage_metric_->range().second)
{
    if (interval_min_ > interval_max_)
    {
        throw_exception("interval_min > interval_max");
    }
}